

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O3

void absl::lts_20240722::internal_statusor::ThrowBadStatusOrAccess(Status *status)

{
  BadStatusOrAccess *this;
  Status local_20;
  
  this = (BadStatusOrAccess *)__cxa_allocate_exception(0x38);
  local_20 = (Status)status->rep_;
  status->rep_ = 0x37;
  BadStatusOrAccess::BadStatusOrAccess(this,&local_20);
  __cxa_throw(this,&BadStatusOrAccess::typeinfo,BadStatusOrAccess::~BadStatusOrAccess);
}

Assistant:

void ThrowBadStatusOrAccess(absl::Status status) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw absl::BadStatusOrAccess(std::move(status));
#else
  ABSL_INTERNAL_LOG(
      FATAL,
      absl::StrCat("Attempting to fetch value instead of handling error ",
                   status.ToString()));
  std::abort();
#endif
}